

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::write<char>
          (basic_writer<fmt::v6::buffer_range<char>_> *this,basic_string_view<char> s,
          format_specs *specs)

{
  ulong uVar1;
  ulong size;
  ulong uVar2;
  
  size = s.size_;
  uVar1 = (ulong)specs->precision;
  uVar2 = size;
  if (uVar1 < size) {
    uVar2 = uVar1;
  }
  if (-1 < (long)uVar1) {
    size = uVar2;
  }
  write<char>(this,s.data_,size,specs);
  return;
}

Assistant:

void write(basic_string_view<Char> s, const format_specs& specs = {}) {
    const Char* data = s.data();
    std::size_t size = s.size();
    if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
      size = code_point_index(s, to_unsigned(specs.precision));
    write(data, size, specs);
  }